

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O3

int wally_confidential_addr_to_addr_segwit
              (char *address,char *confidential_addr_family,char *addr_family,char **output)

{
  int iVar1;
  int iVar2;
  int witver;
  uchar buf [1000];
  int local_414;
  size_t local_410;
  uint8_t local_408 [31];
  uchar local_3e9;
  char local_3e8;
  
  local_414 = 0;
  local_410 = 0;
  iVar2 = -2;
  if ((output != (char **)0x0) && (*output = (char *)0x0, address != (char *)0x0)) {
    iVar1 = blech32_addr_decode(&local_414,local_408,&local_410,confidential_addr_family,address);
    iVar2 = -2;
    if (((iVar1 != 0) && (local_414 == 0)) && ((local_410 == 0x41 || (local_410 == 0x35)))) {
      local_3e9 = '\0';
      local_3e8 = (char)local_410 + -0x21;
      iVar2 = wally_addr_segwit_from_bytes(&local_3e9,local_410 - 0x1f,addr_family,0,output);
    }
    wally_clear(local_408,1000);
  }
  return iVar2;
}

Assistant:

int wally_confidential_addr_to_addr_segwit(
    const char *address,
    const char *confidential_addr_family,
    const char *addr_family,
    char **output)
{
    unsigned char buf[WALLY_BLECH32_MAXLEN];
    unsigned char *hash_bytes_p = &buf[EC_PUBLIC_KEY_LEN - 2];
    int witver = 0;
    size_t written = 0;
    int ret;

    if (output)
        *output = NULL;

    if (!address || !output)
        return WALLY_EINVAL;

    if (!blech32_addr_decode(&witver, buf, &written, confidential_addr_family, address))
        ret = WALLY_EINVAL;
    else if (witver != 0 || (written != 53 && written != 65))
        ret = WALLY_EINVAL;    /* Only v0 witness programs are currently allowed */
    else {
        written = written - EC_PUBLIC_KEY_LEN + 2;
        hash_bytes_p[0] = (unsigned char) witver;
        hash_bytes_p[1] = (unsigned char) (written - 2);
        ret = wally_addr_segwit_from_bytes(hash_bytes_p, written,
                                           addr_family, 0, output);
    }

    wally_clear(buf, sizeof(buf));
    return ret;
}